

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void pulse_server_info_cb(pa_context *c,pa_server_info *i,void *userdata)

{
  undefined8 *in_RDX;
  long in_RSI;
  pulse_dev_list_data *list_data;
  char *local_30;
  char *local_28;
  
  free((void *)*in_RDX);
  free((void *)in_RDX[1]);
  if (*(long *)(in_RSI + 0x30) == 0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = strdup(*(char **)(in_RSI + 0x30));
  }
  *in_RDX = local_28;
  if (*(long *)(in_RSI + 0x38) == 0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = strdup(*(char **)(in_RSI + 0x38));
  }
  in_RDX[1] = local_30;
  (*cubeb_pa_threaded_mainloop_signal)(*(pa_threaded_mainloop **)(in_RDX[4] + 0x10),0);
  return;
}

Assistant:

static void
pulse_server_info_cb(pa_context * c, const pa_server_info * i, void * userdata)
{
  pulse_dev_list_data * list_data = userdata;

  (void)c;

  free(list_data->default_sink_name);
  free(list_data->default_source_name);
  list_data->default_sink_name =
    i->default_sink_name ? strdup(i->default_sink_name) : NULL;
  list_data->default_source_name =
    i->default_source_name ? strdup(i->default_source_name) : NULL;

  WRAP(pa_threaded_mainloop_signal)(list_data->context->mainloop, 0);
}